

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glib_compat.c
# Opt level: O2

GList * g_list_insert_sorted(GList *list,gpointer data,GCompareFunc compare)

{
  gint gVar1;
  GList *pGVar2;
  GList *pGVar3;
  
  pGVar2 = (GList *)g_malloc(0x18);
  pGVar2->data = data;
  pGVar3 = list;
  if (list == (GList *)0x0) {
    pGVar2->next = (GList *)0x0;
    pGVar2->prev = (GList *)0x0;
  }
  else {
    for (; pGVar3 != (GList *)0x0; pGVar3 = pGVar3->next) {
      pGVar2->prev = pGVar3->prev;
      gVar1 = (*compare)(data,pGVar3->data);
      if (gVar1 < 1) {
        pGVar2->next = pGVar3;
        pGVar3->prev = pGVar2;
        if (pGVar3 == list) {
          return pGVar2;
        }
        return list;
      }
    }
    pGVar3 = pGVar2->prev->next;
    pGVar2->prev = pGVar3;
    pGVar2->next = (GList *)0x0;
    pGVar3->next = pGVar2;
    pGVar2 = list;
  }
  return pGVar2;
}

Assistant:

GList *g_list_insert_sorted(GList *list, gpointer data, GCompareFunc compare)
{
    GList *i;
    GList *n = (GList*)g_malloc(sizeof(GList));
    n->data = data;
    if (list == NULL) {
        n->next = n->prev = NULL;
        return n;
    }
    for (i = list; i; i = i->next) {
        n->prev = i->prev;
        if ((*compare)(data, i->data) <= 0) {
            n->next = i;
            i->prev = n;
            if (i == list) return n;
            else return list;
        }
    }
    n->prev = n->prev->next;
    n->next = NULL;
    n->prev->next = n;
    return list;
}